

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O0

ssize_t __thiscall
stream::slice_reader::read(slice_reader *this,int __fd,void *__buf,size_t __nbytes)

{
  slice_reader *psVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  long lVar4;
  undefined4 in_register_00000034;
  undefined1 auVar5 [16];
  streamsize read;
  uint64_t toread;
  uint32_t remaining;
  uint32_t read_pos;
  streamsize nread;
  ssize_t local_88;
  unsigned_long local_70;
  void *local_68;
  ulong local_60;
  unsigned_long local_58;
  undefined1 local_50 [16];
  uint local_3c;
  size_t in_stack_ffffffffffffffc8;
  slice_reader *in_stack_ffffffffffffffd0;
  long local_20;
  void *local_18;
  long local_10;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  seek(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  local_20 = 0;
  for (local_18 = __buf; 0 < (long)local_18; local_18 = (void *)((long)local_18 - lVar4)) {
    auVar5 = std::istream::tellg();
    psVar1 = boost::unordered::detail::
             table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,void*>>,unsigned_int,void*,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
             ::next_node((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,void*>>,unsigned_int,void*,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                          *)&stack0xffffffffffffffc8);
    if (this->slice_size < (uint)psVar1) break;
    local_3c = this->slice_size - (uint)psVar1;
    if (local_3c == 0) {
      seek(auVar5._8_8_,auVar5._0_8_);
      auVar5 = std::istream::tellg();
      local_50 = auVar5;
      psVar1 = boost::unordered::detail::
               table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,void*>>,unsigned_int,void*,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
               ::next_node((table<boost::unordered::detail::map<std::allocator<std::pair<unsigned_int_const,void*>>,unsigned_int,void*,boost::hash<unsigned_int>,std::equal_to<unsigned_int>>>
                            *)local_50);
      if (this->slice_size < (uint)psVar1) break;
      local_3c = this->slice_size - (uint)psVar1;
    }
    local_60 = (ulong)local_3c;
    local_68 = local_18;
    puVar2 = std::min<unsigned_long>(&local_60,(unsigned_long *)&local_68);
    local_58 = *puVar2;
    local_70 = std::numeric_limits<long>::max();
    puVar2 = std::min<unsigned_long>(&local_58,&local_70);
    local_58 = *puVar2;
    std::istream::read((char *)this->is,local_10);
    uVar3 = std::ios::fail();
    if ((uVar3 & 1) != 0) break;
    lVar4 = std::istream::gcount();
    local_20 = lVar4 + local_20;
    local_10 = lVar4 + local_10;
  }
  if ((local_20 == 0) && (local_18 != (void *)0x0)) {
    local_88 = -1;
  }
  else {
    local_88 = local_20;
  }
  return local_88;
}

Assistant:

std::streamsize slice_reader::read(char * buffer, std::streamsize bytes) {
	
	seek(current_slice);
	
	std::streamsize nread = 0;
	
	while(bytes > 0) {
		
		boost::uint32_t read_pos = boost::uint32_t(is->tellg());
		if(read_pos > slice_size) {
			break;
		}
		boost::uint32_t remaining = slice_size - read_pos;
		if(!remaining) {
			seek(current_slice + 1);
			read_pos = boost::uint32_t(is->tellg());
			if(read_pos > slice_size) {
				break;
			}
			remaining = slice_size - read_pos;
		}
		
		boost::uint64_t toread = std::min(boost::uint64_t(remaining), boost::uint64_t(bytes));
		toread = std::min(toread, boost::uint64_t(std::numeric_limits<std::streamsize>::max()));
		if(is->read(buffer, std::streamsize(toread)).fail()) {
			break;
		}
		
		std::streamsize read = is->gcount();
		nread += read, buffer += read, bytes -= read;
	}
	
	return (nread != 0 || bytes == 0) ? nread : -1;
}